

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Block * __thiscall
soul::StructuralParser::parseBracedBlock
          (StructuralParser *this,pool_ptr<soul::AST::Function> *ownerFunction)

{
  Scope *pSVar1;
  bool bVar2;
  Block *this_00;
  Statement *s;
  Context CStack_38;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275da0);
  getContext(&CStack_38,this);
  this_00 = allocate<soul::AST::Block,soul::AST::Context,soul::pool_ptr<soul::AST::Function>&>
                      (this,&CStack_38,ownerFunction);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&CStack_38);
  pSVar1 = this->currentScope;
  this->currentScope = &this_00->super_Scope;
  while( true ) {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2748be);
    if (bVar2) break;
    s = parseStatement(this);
    AST::Block::addStatement(this_00,s);
  }
  this->currentScope = pSVar1;
  return this_00;
}

Assistant:

AST::Block& parseBracedBlock (pool_ptr<AST::Function> ownerFunction)
    {
        expect (Operator::openBrace);
        auto& newBlock = allocate<AST::Block> (getContext(), ownerFunction);
        ScopedScope scope (*this, newBlock);

        while (! matchIf (Operator::closeBrace))
            newBlock.addStatement (parseStatement());

        return newBlock;
    }